

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

string * __thiscall
despot::to_string<std::__cxx11::string>
          (string *__return_storage_ptr__,despot *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  ostringstream oss;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,*(char **)this,*(long *)(this + 8));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(T t) {
  std::ostringstream oss;
	oss << t;
	return oss.str();
}